

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

ElementDocument * __thiscall
Rml::Context::LoadDocumentFromMemory(Context *this,String *string,String *source_url)

{
  unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> this_00;
  ElementDocument *pEVar1;
  UniquePtr<Rml::StreamMemory> stream;
  unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> local_160;
  size_type local_158;
  URL local_150;
  
  local_150.url._M_dataplus._M_p = (string->_M_dataplus)._M_p;
  local_158 = string->_M_string_length;
  ::std::make_unique<Rml::StreamMemory,unsigned_char_const*,unsigned_long>
            ((uchar **)&local_160,(unsigned_long *)&local_150);
  this_00._M_t.super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>.
  _M_t.super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
  super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
       local_160._M_t.
       super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t.
       super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
       super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl;
  URL::URL(&local_150,source_url);
  StreamMemory::SetSourceURL
            ((StreamMemory *)
             this_00._M_t.
             super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t.
             super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
             super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,&local_150);
  URL::~URL(&local_150);
  pEVar1 = LoadDocument(this,(Stream *)
                             local_160._M_t.
                             super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                             .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl);
  ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
            (&local_160);
  return pEVar1;
}

Assistant:

ElementDocument* Context::LoadDocumentFromMemory(const String& string, const String& source_url)
{
	// Open the stream based on the string contents.
	auto stream = MakeUnique<StreamMemory>(reinterpret_cast<const byte*>(string.c_str()), string.size());

	stream->SetSourceURL(source_url);

	// Load the document from the stream.
	ElementDocument* document = LoadDocument(stream.get());

	return document;
}